

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool Data649::saveArchive(char *fname,Issues *issues)

{
  int iVar1;
  pointer pIVar2;
  pointer pDVar3;
  ostream *this;
  Draw *draw;
  pointer pDVar4;
  pointer pIVar5;
  long lVar6;
  ofstream fout;
  undefined8 auStack_220 [62];
  
  std::ofstream::ofstream((ostream *)&fout,fname,_S_out);
  pIVar2 = (issues->super__Vector_base<Data649::Issue,_std::allocator<Data649::Issue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pIVar5 = (issues->super__Vector_base<Data649::Issue,_std::allocator<Data649::Issue>_>).
                _M_impl.super__Vector_impl_data._M_start; pIVar5 != pIVar2; pIVar5 = pIVar5 + 1) {
    *(undefined8 *)((long)auStack_220 + *(long *)(_fout + -0x18)) = 6;
    this = (ostream *)std::ostream::operator<<((ostream *)&fout,pIVar5->year);
    *(undefined8 *)(this + *(long *)(*(long *)this + -0x18) + 0x10) = 4;
    std::ostream::operator<<(this,pIVar5->idYear);
    pDVar3 = (pIVar5->draws).super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pDVar4 = (pIVar5->draws).super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                  _M_impl.super__Vector_impl_data._M_start; pDVar4 != pDVar3; pDVar4 = pDVar4 + 1) {
      std::operator<<((ostream *)&fout," ");
      for (lVar6 = 4; lVar6 != 0x1c; lVar6 = lVar6 + 4) {
        iVar1 = *(int *)((long)(pDVar4->nums)._M_elems + lVar6 + -4);
        *(undefined8 *)((long)auStack_220 + *(long *)(_fout + -0x18)) = 3;
        std::ostream::operator<<((ostream *)&fout,iVar1);
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&fout);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  return true;
}

Assistant:

bool saveArchive(const char * fname, const Issues & issues) {
    std::ofstream fout(fname);

    for (auto & issue : issues) {
        fout << std::setw(6) << issue.year << std::setw(4) << issue.idYear;
        for (auto & draw : issue.draws) {
            fout << " ";
            for (auto num : draw.nums) {
                fout << std::setw(3) << num;
            }
        }
        fout << std::endl;
    }

    fout.close();

    return true;
}